

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(FeatureDescription *a,FeatureDescription *b)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  FeatureType *a_00;
  FeatureType *b_00;
  FeatureDescription *b_local;
  FeatureDescription *a_local;
  
  psVar2 = FeatureDescription::name_abi_cxx11_(a);
  psVar3 = FeatureDescription::name_abi_cxx11_(b);
  bVar1 = std::operator!=(psVar2,psVar3);
  if (bVar1) {
    a_local._7_1_ = false;
  }
  else {
    psVar2 = FeatureDescription::shortdescription_abi_cxx11_(a);
    psVar3 = FeatureDescription::shortdescription_abi_cxx11_(b);
    bVar1 = std::operator!=(psVar2,psVar3);
    if (bVar1) {
      a_local._7_1_ = false;
    }
    else {
      a_00 = FeatureDescription::type(a);
      b_00 = FeatureDescription::type(b);
      bVar1 = operator!=(a_00,b_00);
      if (bVar1) {
        a_local._7_1_ = false;
      }
      else {
        a_local._7_1_ = true;
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const FeatureDescription& a,
                        const FeatureDescription& b) {
            if (a.name() != b.name()) {
                return false;
            }
            if (a.shortdescription() != b.shortdescription()) {
                return false;
            }
            if (a.type() != b.type()) {
                return false;
            }
            return true;
        }